

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_nreverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp psVar2;
  
  if (ls == (sexp)&DAT_0000023e) {
    psVar2 = (sexp)&DAT_0000023e;
  }
  else {
    if ((((ulong)ls & 3) != 0) || (ls->tag != 6)) {
      psVar2 = sexp_type_exception(ctx,self,6,ls);
      return psVar2;
    }
    psVar1 = (ls->value).type.cpl;
    (ls->value).string.offset = 0x23e;
    if (((ulong)psVar1 & 3) != 0) {
      return ls;
    }
    do {
      psVar2 = psVar1;
      if (psVar2->tag != 6) {
        return ls;
      }
      psVar1 = (psVar2->value).type.cpl;
      (psVar2->value).type.cpl = ls;
      ls = psVar2;
    } while (((ulong)psVar1 & 3) == 0);
  }
  return psVar2;
}

Assistant:

sexp sexp_nreverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp a, b, tmp;
  if (ls == SEXP_NULL) return ls;
  sexp_assert_type(ctx, sexp_pairp, SEXP_PAIR, ls);
  b = ls;
  a = sexp_cdr(ls);
  sexp_cdr(b) = SEXP_NULL;
  for ( ; sexp_pairp(a); b=a, a=tmp) {
    tmp = sexp_cdr(a);
    sexp_cdr(a) = b;
  }
  return b;
}